

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

void __thiscall sc_core::vcd_trace_file::~vcd_trace_file(vcd_trace_file *this)

{
  pointer ppvVar1;
  vcd_trace *pvVar2;
  bool bVar3;
  int i;
  long lVar4;
  unit_type now_units_low;
  unit_type now_units_high;
  unit_type local_28;
  unit_type local_20;
  
  (this->super_sc_trace_file_base).super_sc_trace_file._vptr_sc_trace_file =
       (_func_int **)&PTR_trace_00264e40;
  (this->super_sc_trace_file_base).super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_00264f80;
  bVar3 = sc_trace_file_base::is_initialized(&this->super_sc_trace_file_base);
  if (bVar3) {
    bVar3 = get_time_stamp(this,&local_20,&local_28);
    if (bVar3) {
      print_time_stamp(this,local_20,local_28);
    }
  }
  lVar4 = 0;
  while( true ) {
    ppvVar1 = (this->traces).
              super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->traces).
                            super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1) >> 3) <=
        lVar4) break;
    pvVar2 = ppvVar1[lVar4];
    if (pvVar2 != (vcd_trace *)0x0) {
      (*pvVar2->_vptr_vcd_trace[5])();
    }
    lVar4 = lVar4 + 1;
  }
  std::_Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::~_Vector_base
            (&(this->traces).
              super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>);
  sc_trace_file_base::~sc_trace_file_base(&this->super_sc_trace_file_base);
  return;
}

Assistant:

vcd_trace_file::~vcd_trace_file()
{
    unit_type now_units_high, now_units_low;
    if (is_initialized() && get_time_stamp(now_units_high,now_units_low)) {
        print_time_stamp(now_units_high, now_units_low);
    }

    for( int i = 0; i < (int)traces.size(); i++ ) {
        vcd_trace* t = traces[i];
        delete t;
    }
}